

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O3

void Imf_2_5::Attribute::registerAttributeType(char *typeName,_func_Attribute_ptr *newAttribute)

{
  _Base_ptr p_Var1;
  int iVar2;
  uint uVar3;
  iterator iVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  ArgExc *this;
  bool bVar8;
  key_type *__x;
  char *__s2;
  _Base_ptr p_Var9;
  stringstream _iex_throw_s;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  __x = (key_type *)newAttribute;
  anon_unknown_0::typeMap();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar4 = std::
          map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
          ::find((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                  *)typeName,__x);
  p_Var9 = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header
  ;
  if ((_Rb_tree_header *)iVar4._M_node !=
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"Cannot register image file attribute type \"",0x2b);
    poVar7 = std::operator<<(local_1a0,typeName);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\". The type has already been registered.",0x28);
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,(stringstream *)local_1b0);
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  p_Var1 = anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  if (anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent == (_Base_ptr)0x0) {
LAB_001afabb:
    if (p_Var9 != anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left) {
      lVar5 = std::_Rb_tree_decrement(p_Var9);
      __s2 = *(char **)(lVar5 + 0x20);
      goto LAB_001afad0;
    }
  }
  else {
    do {
      p_Var9 = p_Var1;
      __s2 = *(char **)(p_Var9 + 1);
      uVar3 = strcmp(typeName,__s2);
      p_Var1 = (&p_Var9->_M_left)[~uVar3 >> 0x1f];
    } while ((&p_Var9->_M_left)[~uVar3 >> 0x1f] != (_Base_ptr)0x0);
    if ((int)uVar3 < 0) goto LAB_001afabb;
LAB_001afad0:
    iVar2 = strcmp(__s2,typeName);
    if (-1 < iVar2) goto LAB_001afb30;
  }
  if ((_Rb_tree_header *)p_Var9 ==
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header) {
    bVar8 = true;
  }
  else {
    iVar2 = strcmp(typeName,*(char **)(p_Var9 + 1));
    bVar8 = SUB41((uint)iVar2 >> 0x1f,0);
  }
  p_Var6 = (_Rb_tree_node_base *)operator_new(0x30);
  *(char **)(p_Var6 + 1) = typeName;
  p_Var6[1]._M_parent = (_Base_ptr)newAttribute;
  std::_Rb_tree_insert_and_rebalance
            (bVar8,p_Var6,p_Var9,
             &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
              _M_header);
  anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count
       + 1;
LAB_001afb30:
  pthread_mutex_unlock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
  return;
}

Assistant:

void	
Attribute::registerAttributeType (const char typeName[],
			          Attribute *(*newAttribute)())
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    if (tMap.find (typeName) != tMap.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot register image file attribute "
			    "type \"" << typeName << "\". "
			    "The type has already been registered.");

    tMap.insert (TypeMap::value_type (typeName, newAttribute));
}